

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::gen_queries(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  GLuint ids;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ids,"GL_INVALID_VALUE is generated if n is negative.",&local_31);
  NegativeTestContext::beginSection(ctx,(string *)&ids);
  std::__cxx11::string::~string((string *)&ids);
  ids = 0;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,-1,&ids);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void gen_queries (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	GLuint ids = 0;
	ctx.glGenQueries	(-1, &ids);
	ctx.expectError		(GL_INVALID_VALUE);
	ctx.endSection();
}